

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.cpp
# Opt level: O2

int mbedtls_cipher_setup(mbedtls_cipher_context_t *ctx,mbedtls_cipher_info_t *cipher_info)

{
  code *pcVar1;
  void *pvVar2;
  
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    return -0x6100;
  }
  ctx->iv[8] = '\0';
  ctx->iv[9] = '\0';
  ctx->iv[10] = '\0';
  ctx->iv[0xb] = '\0';
  ctx->iv[0xc] = '\0';
  ctx->iv[0xd] = '\0';
  ctx->iv[0xe] = '\0';
  ctx->iv[0xf] = '\0';
  ctx->iv_size = 0;
  ctx->unprocessed_len = 0;
  ctx->iv[0] = '\0';
  ctx->iv[1] = '\0';
  ctx->iv[2] = '\0';
  ctx->iv[3] = '\0';
  ctx->iv[4] = '\0';
  ctx->iv[5] = '\0';
  ctx->iv[6] = '\0';
  ctx->iv[7] = '\0';
  ctx->unprocessed_data[0] = '\0';
  ctx->unprocessed_data[1] = '\0';
  ctx->unprocessed_data[2] = '\0';
  ctx->unprocessed_data[3] = '\0';
  ctx->unprocessed_data[4] = '\0';
  ctx->unprocessed_data[5] = '\0';
  ctx->unprocessed_data[6] = '\0';
  ctx->unprocessed_data[7] = '\0';
  ctx->unprocessed_data[8] = '\0';
  ctx->unprocessed_data[9] = '\0';
  ctx->unprocessed_data[10] = '\0';
  ctx->unprocessed_data[0xb] = '\0';
  ctx->unprocessed_data[0xc] = '\0';
  ctx->unprocessed_data[0xd] = '\0';
  ctx->unprocessed_data[0xe] = '\0';
  ctx->unprocessed_data[0xf] = '\0';
  ctx->cipher_ctx = (void *)0x0;
  ctx->cipher_info = (mbedtls_cipher_info_t *)0x0;
  ctx->key_bitlen = 0;
  ctx->operation = MBEDTLS_DECRYPT;
  pcVar1 = *(code **)(*(long *)((long)mbedtls_cipher_base_lookup_table +
                               (ulong)(*(uint *)&cipher_info->field_0x8 >> 0x17 & 0xf8)) + 0x20);
  if (pcVar1 != (code *)0x0) {
    pvVar2 = (void *)(*pcVar1)();
    ctx->cipher_ctx = pvVar2;
    if (pvVar2 == (void *)0x0) {
      return -0x6180;
    }
  }
  ctx->cipher_info = cipher_info;
  return 0;
}

Assistant:

int mbedtls_cipher_setup(mbedtls_cipher_context_t *ctx,
                         const mbedtls_cipher_info_t *cipher_info)
{
    if (cipher_info == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    memset(ctx, 0, sizeof(mbedtls_cipher_context_t));

    if (mbedtls_cipher_get_base(cipher_info)->ctx_alloc_func != NULL) {
        ctx->cipher_ctx = mbedtls_cipher_get_base(cipher_info)->ctx_alloc_func();
        if (ctx->cipher_ctx == NULL) {
            return MBEDTLS_ERR_CIPHER_ALLOC_FAILED;
        }
    }

    ctx->cipher_info = cipher_info;

    return 0;
}